

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node16::GrowNode4(ART *art,Node *node16,Node *node4)

{
  uint8_t i;
  Node4 *pNVar1;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar2;
  ulong uVar3;
  byte bVar4;
  
  pNVar1 = Node::Ref<duckdb::Node4>(art,(Node)(node4->super_IndexPointer).data,NODE_4);
  pBVar2 = BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(art,node16);
  Node::SetGateStatus(node16,(GateStatus)((node4->super_IndexPointer).data >> 0x3f));
  bVar4 = (pNVar1->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>).count;
  pBVar2->count = bVar4;
  for (uVar3 = 0; uVar3 < bVar4; uVar3 = uVar3 + 1) {
    pBVar2->key[uVar3] =
         (pNVar1->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>).key[uVar3];
    pBVar2->children[uVar3].super_IndexPointer.data =
         (pNVar1->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>).children[uVar3].
         super_IndexPointer.data;
    bVar4 = (pNVar1->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>).count;
  }
  (pNVar1->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>).count = '\0';
  Node::Free(art,node4);
  return;
}

Assistant:

void Node16::GrowNode4(ART &art, Node &node16, Node &node4) {
	auto &n4 = Node::Ref<Node4>(art, node4, NType::NODE_4);
	auto &n16 = New(art, node16);
	node16.SetGateStatus(node4.GetGateStatus());

	n16.count = n4.count;
	for (uint8_t i = 0; i < n4.count; i++) {
		n16.key[i] = n4.key[i];
		n16.children[i] = n4.children[i];
	}

	n4.count = 0;
	Node::Free(art, node4);
}